

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalForcesContIntDamping
          (ChElementShellANCF_3833 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  double *scalar;
  RhsNested pMVar1;
  long lVar2;
  double *pdVar3;
  ChElementShellANCF_3833 *pCVar4;
  Index startCol;
  ulong uVar5;
  ChElementShellANCF_3833 *this_00;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  ChMatrixNM<double,_6,_6> D;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP E_BlockDamping;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  VectorNIP E3_Block;
  VectorNIP E2_Block;
  VectorNIP E1_Block;
  VectorNIP SPK2_1_Block;
  Map<Eigen::Matrix<double,_72,_1,_0,_72,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  long local_23b8;
  undefined1 local_2360 [24];
  long lStack_2348;
  XprTypeNested pMStack_2340;
  variable_if_dynamic<long,__1> vStack_2338;
  scalar_constant_op<double> sStack_2330;
  RhsNested local_2328;
  Matrix<double,_18,_1,_0,_18,_1> *local_2320;
  Layer *local_2310;
  XprTypeNested local_2300;
  variable_if_dynamic<long,__1> local_22f8;
  variable_if_dynamic<long,__1> local_22f0;
  Index local_22e8;
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *local_22e0;
  Layer *local_22c8;
  XprTypeNested local_22b8;
  variable_if_dynamic<long,__1> local_22b0;
  scalar_constant_op<double> local_22a8;
  RhsNested local_22a0;
  Matrix<double,_18,_1,_0,_18,_1> *local_2298;
  Index local_2248;
  undefined1 local_2240 [16];
  scalar_constant_op<double> sStack_2230;
  RhsNested pMStack_2228;
  ChLoadableUV CStack_2220;
  Matrix<double,_18,_1,_0,_18,_1> *pMStack_2218;
  MatrixNx6 *pMStack_2210;
  scalar_constant_op<double> local_2208;
  PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *local_2200;
  double local_21f8;
  ChLoadableUV local_21f0;
  Matrix<double,_18,_1,_0,_18,_1> *local_21e8;
  scalar_constant_op<double> sStack_21e0;
  ChLoadableUV local_21d8;
  double local_21d0;
  Layer *local_21c8;
  double local_21c0;
  ChLoadableUV local_21b8;
  scalar_constant_op<double> local_21b0;
  RhsNested local_21a8;
  ChLoadableUV local_21a0;
  Layer *local_2198;
  double local_2190;
  ChLoadableUV local_2188;
  scalar_constant_op<double> local_2180;
  RhsNested local_2178;
  ChLoadableUV local_2170;
  double local_2168;
  double local_2160;
  double *local_2158;
  ChLoadableUV local_2148;
  double *local_2140;
  double local_2138;
  ChLoadableUV local_2130;
  double *local_2128;
  scalar_constant_op<double> local_2120;
  ChLoadableUV local_2118;
  undefined1 *local_2110;
  double local_2108;
  ChLoadableUV local_2100;
  double local_20f8;
  double local_20f0;
  double local_20e8;
  ChLoadableUV local_20d0;
  ChLoadableUV local_20c0;
  double local_20b8;
  double dStack_20b0;
  double local_20a8;
  Matrix<double,_18,_1,_0,_18,_1> *local_20a0;
  ChLoadableUV local_2090;
  double local_2088;
  double local_2080;
  double local_2078;
  Layer *local_2060;
  ChLoadableUV local_2050;
  double local_2048;
  double local_2040;
  double local_2038;
  double *local_2030;
  ChLoadableUV local_2020;
  double local_2018;
  double local_2010;
  double local_2008;
  double adStack_2000 [2];
  double *local_1ff0;
  ChLoadableUV local_1fe0;
  double local_1fd8;
  double local_1fd0;
  double local_1fc8;
  undefined1 *local_1fc0;
  ChLoadableUV local_1fb0;
  double local_1fa8;
  double local_1fa0;
  double local_1f98;
  double adStack_1f70 [18];
  double adStack_1ee0 [18];
  double adStack_1e50 [18];
  double adStack_1dc0 [21];
  long local_1d18;
  double *local_1d10;
  Matrix<double,__1,__1,_1,__1,__1> *local_1d08;
  ChElementShellANCF_3833 *local_1d00;
  undefined1 local_1cf8 [16];
  XprTypeNested pMStack_1ce8;
  variable_if_dynamic<long,__1> vStack_1ce0;
  variable_if_dynamic<long,__1> vStack_1cd8;
  scalar_constant_op<double> sStack_1cd0;
  ChVectorDynamic<> *local_1c28;
  double *local_1c20;
  double *local_1c18;
  scalar_constant_op<double> *local_1c10;
  double *local_1c08;
  double *local_1c00;
  double *local_1bf8;
  scalar_constant_op<double> *local_1bf0;
  double *local_1be8;
  double *local_1be0;
  ChLoadableUV *local_1bd8;
  ulong local_1bd0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_1bc8;
  ChMatrixNM<double,_6,_6> local_1ba0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_1a78;
  undefined1 local_1a50 [64];
  double local_1a10;
  RhsNested local_1a08;
  Matrix<double,_18,_1,_0,_18,_1> local_19f0;
  Matrix<double,_18,_1,_0,_18,_1> local_1960;
  Matrix<double,_18,_1,_0,_18,_1> local_18d0;
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_1840 [144];
  Matrix<double,_18,_1,_0,_18,_1> local_17b0;
  Matrix<double,_18,_1,_0,_18,_1> local_1720;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
  local_1688;
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_15f0 [144];
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_1560 [144];
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_14d0 [144];
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_1440 [144];
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_13b0 [144];
  PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> local_1320 [144];
  Matrix<double,_18,_1,_0,_18,_1> local_1290;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_1200;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_11d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_11b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_1188;
  undefined1 local_1160 [288];
  Matrix<double,_18,_1,_0,_18,_1> local_1040;
  shared_ptr<chrono::fea::ChNodeFEAxyzDD> local_fb0 [9];
  Layer local_f20 [4];
  Layer local_e90 [4];
  double local_e00 [18];
  double local_d70 [18];
  double local_ce0 [18];
  Matrix<double,_18,_1,_0,_18,_1> local_c50;
  Matrix<double,_18,_1,_0,_18,_1> local_bc0;
  Matrix<double,_18,_1,_0,_18,_1> local_b30;
  double local_aa0 [18];
  double local_a10 [18];
  double local_980 [18];
  undefined1 local_8f0 [144];
  undefined1 local_860 [144];
  undefined1 local_7d0 [144];
  DenseBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_> local_740 [576];
  MatrixNx6 local_500;
  
  local_1c28 = Fi;
  CalcCombinedCoordMatrix(this,&local_500);
  Eigen::DenseBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>::setZero(local_740);
  local_23b8 = 0;
  local_1d18 = 0;
  local_1bd8 = &local_2090;
  local_1be0 = adStack_1ee0;
  scalar = &this->m_Alpha;
  local_1be8 = local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x1a;
  pMVar1 = (RhsNested)(local_1160 + 0x90);
  local_1c00 = local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x12;
  local_1bf0 = &local_21b0;
  local_1d08 = &this->m_SD;
  local_1bf8 = adStack_2000;
  local_1d10 = &local_20b8;
  xpr = &this->m_kGQ;
  local_1c08 = adStack_1e50;
  local_1c10 = &local_2120;
  local_1c18 = adStack_1f70;
  local_1c20 = adStack_1dc0;
  startCol = 0;
  uVar5 = 0;
  local_1d00 = this;
  while (uVar5 < (ulong)(long)local_1d00->m_numLayers) {
    local_2248 = startCol;
    local_1bd0 = uVar5;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_24,_54,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false> *)&local_1ba0,
               local_1d08,0,startCol);
    pMStack_2210 = &local_500;
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    Eigen::PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,24,54,false>>,Eigen::Matrix<double,24,6,1,24,6>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)local_1160,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>_>,_Eigen::Matrix<double,_24,_6,_1,_24,_6>,_0>_>
                *)local_2240);
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x0;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)&local_c50;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x0;
    sStack_21e0.m_other = 1.48219693752374e-323;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 0.0;
    local_2198 = (Layer *)local_aa0;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 0.0;
    local_2178 = (RhsNested)0x4;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x0;
    local_2128 = (double *)local_8f0;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x0;
    local_2108 = 2.47032822920623e-323;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)local_1160;
    CStack_2220 = (ChLoadableUV)local_1160;
    local_21f0 = (ChLoadableUV)local_1160;
    local_21c8 = (Layer *)local_fb0;
    local_21b8 = (ChLoadableUV)local_1160;
    local_2188 = (ChLoadableUV)local_1160;
    local_2158 = local_e00;
    local_2148 = (ChLoadableUV)local_1160;
    local_2118 = (ChLoadableUV)local_1160;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_1840,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x0;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x0;
    sStack_21e0.m_other = 0.0;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 0.0;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 0.0;
    local_2178 = (RhsNested)0x1;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x0;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x0;
    local_2108 = 9.88131291682493e-324;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)local_1160;
    CStack_2220 = (ChLoadableUV)local_1160;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)local_1160;
    local_21f0 = (ChLoadableUV)local_1160;
    local_21c8 = (Layer *)local_fb0;
    local_21b8 = (ChLoadableUV)local_1160;
    local_2198 = (Layer *)local_fb0;
    local_2188 = (ChLoadableUV)local_1160;
    local_2158 = local_e00;
    local_2148 = (ChLoadableUV)local_1160;
    local_2128 = local_e00;
    local_2118 = (ChLoadableUV)local_1160;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_1320,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    local_2240._0_8_ = 1.0;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1320;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_> *)
               &local_1ba0,(Scalar *)local_2240);
    local_2240._0_8_ = 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_> *)local_1320,(Scalar *)local_2240
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_2240,scalar,(StorageBaseType *)local_1840);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_1320,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2240);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)&local_1ba0,xpr,
               local_23b8,0);
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    local_2360._0_8_ = local_1320;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_2360,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_2240);
    CStack_2220 = (ChLoadableUV)local_1160;
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x12;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)&local_bc0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x12;
    sStack_21e0.m_other = 1.48219693752374e-323;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 8.89318162514244e-323;
    local_2198 = (Layer *)local_a10;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 8.89318162514244e-323;
    local_2178 = (RhsNested)0x4;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x12;
    local_2128 = (double *)local_860;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x12;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1840;
    local_2108 = 2.47032822920623e-323;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)pMVar1;
    local_21f0 = CStack_2220;
    local_21c8 = local_f20;
    local_21b8 = CStack_2220;
    local_2188 = CStack_2220;
    local_2158 = local_d70;
    local_2148 = CStack_2220;
    local_2118 = CStack_2220;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)&local_1ba0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x12;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x12;
    sStack_21e0.m_other = 0.0;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 8.89318162514244e-323;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 8.89318162514244e-323;
    local_2178 = (RhsNested)0x1;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x12;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x12;
    local_2108 = 9.88131291682493e-324;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)pMVar1;
    CStack_2220 = (ChLoadableUV)local_1160;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)pMVar1;
    local_21f0 = (ChLoadableUV)local_1160;
    local_21c8 = local_f20;
    local_21b8 = (ChLoadableUV)local_1160;
    local_2198 = local_f20;
    local_2188 = (ChLoadableUV)local_1160;
    local_2158 = local_d70;
    local_2148 = (ChLoadableUV)local_1160;
    local_2128 = local_d70;
    local_2118 = (ChLoadableUV)local_1160;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_13b0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    local_2240._0_8_ = 1.0;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_13b0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_> *)
               &local_1ba0,(Scalar *)local_2240);
    local_2240._0_8_ = 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_> *)local_13b0,(Scalar *)local_2240
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_2240,scalar,(StorageBaseType *)local_1840);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_13b0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2240);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)&local_1ba0,xpr,
               local_23b8,0);
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    local_2360._0_8_ = local_13b0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_2360,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_2240);
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x24;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)&local_b30;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x24;
    sStack_21e0.m_other = 1.48219693752374e-323;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 1.77863632502849e-322;
    local_2198 = (Layer *)local_980;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 1.77863632502849e-322;
    local_2178 = (RhsNested)0x4;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x24;
    local_2128 = (double *)local_7d0;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x24;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1840;
    local_2108 = 2.47032822920623e-323;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)&local_1040;
    CStack_2220 = (ChLoadableUV)local_1160;
    local_21f0 = (ChLoadableUV)local_1160;
    local_21c8 = local_e90;
    local_21b8 = (ChLoadableUV)local_1160;
    local_2188 = (ChLoadableUV)local_1160;
    local_2158 = local_ce0;
    local_2148 = (ChLoadableUV)local_1160;
    local_2118 = (ChLoadableUV)local_1160;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)&local_1ba0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    CStack_2220 = (ChLoadableUV)local_1160;
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x24;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x24;
    sStack_21e0.m_other = 0.0;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 1.77863632502849e-322;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 1.77863632502849e-322;
    local_2178 = (RhsNested)0x1;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x24;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x24;
    local_2108 = 9.88131291682493e-324;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)&local_1040;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)&local_1040;
    local_21f0 = CStack_2220;
    local_21c8 = local_e90;
    local_21b8 = CStack_2220;
    local_2198 = local_e90;
    local_2188 = CStack_2220;
    local_2158 = local_ce0;
    local_2148 = CStack_2220;
    local_2128 = local_ce0;
    local_2118 = CStack_2220;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_1440,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    local_2240._0_8_ = 1.0;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1440;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_> *)
               &local_1ba0,(Scalar *)local_2240);
    local_2240._0_8_ = 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_> *)local_1440,(Scalar *)local_2240
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_2240,scalar,(StorageBaseType *)local_1840);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_1440,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2240);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)&local_1ba0,xpr,
               local_23b8,0);
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    local_2360._0_8_ = local_1440;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_2360,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_2240);
    local_2208.m_other = (double)local_1160;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)0x24;
    local_21f8 = 0.0;
    local_21e8 = &local_bc0;
    local_21f0 = (ChLoadableUV)0x36;
    local_21d0 = 8.89318162514244e-323;
    local_21c8 = (Layer *)0x3;
    local_21c0 = 2.66795448754273e-322;
    local_2198 = (Layer *)0x24;
    local_2180.m_other = (double)local_a10;
    local_2190 = 4.94065645841247e-324;
    local_2188 = (ChLoadableUV)0x36;
    local_2168 = 8.89318162514244e-323;
    local_2160 = 1.97626258336499e-323;
    local_2158 = (double *)0x36;
    local_2128 = (double *)0x24;
    local_2110 = local_860;
    local_2120.m_other = 9.88131291682493e-324;
    local_2118 = (ChLoadableUV)0x36;
    local_20f8 = 8.89318162514244e-323;
    local_20f0 = 2.47032822920623e-323;
    local_20e8 = 2.66795448754273e-322;
    local_20a0 = &local_b30;
    local_20b8 = 8.89318162514244e-323;
    dStack_20b0 = 0.0;
    local_20a8 = 2.66795448754273e-322;
    local_2088 = 1.77863632502849e-322;
    local_2080 = 1.48219693752374e-323;
    local_2030 = local_980;
    local_2078 = 2.66795448754273e-322;
    local_2048 = 8.89318162514244e-323;
    local_2040 = 4.94065645841247e-324;
    local_2038 = 2.66795448754273e-322;
    local_2018 = 1.77863632502849e-322;
    local_2010 = 1.97626258336499e-323;
    local_1fc0 = local_7d0;
    local_2008 = 2.66795448754273e-322;
    local_1fd8 = 8.89318162514244e-323;
    local_1fd0 = 9.88131291682493e-324;
    local_1fc8 = 2.66795448754273e-322;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1840;
    local_1fa8 = 1.77863632502849e-322;
    local_1fa0 = 2.47032822920623e-323;
    local_1f98 = 2.66795448754273e-322;
    pMStack_2218 = &local_1040;
    local_21d8 = (ChLoadableUV)local_2208.m_other;
    local_21b0.m_other = (double)local_e90;
    local_21a0 = (ChLoadableUV)local_2208.m_other;
    local_2170 = (ChLoadableUV)local_2208.m_other;
    local_2140 = local_ce0;
    local_2130 = (ChLoadableUV)local_2208.m_other;
    local_2100 = (ChLoadableUV)local_2208.m_other;
    local_20d0 = (ChLoadableUV)pMVar1;
    local_20c0 = (ChLoadableUV)local_2208.m_other;
    local_2090 = (ChLoadableUV)local_2208.m_other;
    local_2060 = local_f20;
    local_2050 = (ChLoadableUV)local_2208.m_other;
    local_2020 = (ChLoadableUV)local_2208.m_other;
    local_1ff0 = local_d70;
    local_1fe0 = (ChLoadableUV)local_2208.m_other;
    local_1fb0 = (ChLoadableUV)local_2208.m_other;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)&local_1ba0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    CStack_2220 = (ChLoadableUV)local_1160;
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x12;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x24;
    sStack_21e0.m_other = 0.0;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 8.89318162514244e-323;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 1.77863632502849e-322;
    local_2178 = (RhsNested)0x1;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x12;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x24;
    local_2108 = 9.88131291682493e-324;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)pMVar1;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)&local_1040;
    local_21f0 = CStack_2220;
    local_21c8 = local_f20;
    local_21b8 = CStack_2220;
    local_2198 = local_e90;
    local_2188 = CStack_2220;
    local_2158 = local_d70;
    local_2148 = CStack_2220;
    local_2128 = local_ce0;
    local_2118 = CStack_2220;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_14d0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_2240,scalar,(StorageBaseType *)local_1840);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_14d0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2240);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)&local_1ba0,xpr,
               local_23b8,0);
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    local_2360._0_8_ = local_14d0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_2360,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_2240);
    pdVar3 = local_1d10;
    local_21e8 = &local_c50;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)0x24;
    local_21f8 = 0.0;
    local_21f0 = (ChLoadableUV)0x36;
    local_21d0 = 0.0;
    local_21c8 = (Layer *)0x3;
    local_21c0 = 2.66795448754273e-322;
    local_2198 = (Layer *)0x24;
    local_2180.m_other = (double)local_aa0;
    local_2190 = 4.94065645841247e-324;
    local_2188 = (ChLoadableUV)0x36;
    local_2168 = 0.0;
    local_2160 = 1.97626258336499e-323;
    local_2158 = (double *)0x36;
    local_2128 = (double *)0x24;
    local_2110 = local_8f0;
    local_2120.m_other = 9.88131291682493e-324;
    local_2118 = (ChLoadableUV)0x36;
    local_20f8 = 0.0;
    local_20f0 = 2.47032822920623e-323;
    local_20e8 = 2.66795448754273e-322;
    *local_1d10 = 0.0;
    pdVar3[1] = 0.0;
    local_20a8 = 2.66795448754273e-322;
    local_2088 = 1.77863632502849e-322;
    local_2080 = 1.48219693752374e-323;
    local_2030 = local_980;
    local_2078 = 2.66795448754273e-322;
    local_2048 = 0.0;
    local_2040 = 4.94065645841247e-324;
    local_2038 = 2.66795448754273e-322;
    local_1fc0 = local_7d0;
    local_2018 = 1.77863632502849e-322;
    local_2010 = 1.97626258336499e-323;
    local_2008 = 2.66795448754273e-322;
    local_1fd8 = 0.0;
    local_1fd0 = 9.88131291682493e-324;
    local_1fc8 = 2.66795448754273e-322;
    local_1fa8 = 1.77863632502849e-322;
    local_1fa0 = 2.47032822920623e-323;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1840;
    local_1f98 = 2.66795448754273e-322;
    pMStack_2218 = &local_1040;
    local_2208.m_other = (double)local_1160;
    local_21d8 = (ChLoadableUV)local_1160;
    local_21b0.m_other = (double)local_e90;
    local_21a0 = (ChLoadableUV)local_1160;
    local_2170 = (ChLoadableUV)local_1160;
    local_2140 = local_ce0;
    local_2130 = (ChLoadableUV)local_1160;
    local_2100 = (ChLoadableUV)local_1160;
    local_20d0 = (ChLoadableUV)local_1160;
    local_20c0 = (ChLoadableUV)local_1160;
    local_20a0 = &local_b30;
    local_2090 = (ChLoadableUV)local_1160;
    local_2060 = (Layer *)local_fb0;
    local_2050 = (ChLoadableUV)local_1160;
    local_2020 = (ChLoadableUV)local_1160;
    local_1ff0 = local_e00;
    local_1fe0 = (ChLoadableUV)local_1160;
    local_1fb0 = (ChLoadableUV)local_1160;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)&local_1ba0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x0;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x24;
    sStack_21e0.m_other = 0.0;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 0.0;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 1.77863632502849e-322;
    local_2178 = (RhsNested)0x1;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x0;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x24;
    local_2108 = 9.88131291682493e-324;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)local_1160;
    CStack_2220 = (ChLoadableUV)local_1160;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)&local_1040;
    local_21f0 = (ChLoadableUV)local_1160;
    local_21c8 = (Layer *)local_fb0;
    local_21b8 = (ChLoadableUV)local_1160;
    local_2198 = local_e90;
    local_2188 = (ChLoadableUV)local_1160;
    local_2158 = local_e00;
    local_2148 = (ChLoadableUV)local_1160;
    local_2128 = local_ce0;
    local_2118 = (ChLoadableUV)local_1160;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_1560,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_2240,scalar,(StorageBaseType *)local_1840);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_1560,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2240);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)&local_1ba0,xpr,
               local_23b8,0);
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    local_2360._0_8_ = local_1560;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_2360,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_2240);
    pdVar3 = local_1d10;
    local_21e8 = &local_c50;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)0x12;
    local_21f8 = 0.0;
    local_21f0 = (ChLoadableUV)0x36;
    local_21d0 = 0.0;
    local_21c8 = (Layer *)0x3;
    local_21c0 = 2.66795448754273e-322;
    local_2198 = (Layer *)0x12;
    local_2180.m_other = (double)local_aa0;
    local_2190 = 4.94065645841247e-324;
    local_2188 = (ChLoadableUV)0x36;
    local_2168 = 0.0;
    local_2160 = 1.97626258336499e-323;
    local_2158 = (double *)0x36;
    local_2128 = (double *)0x12;
    local_2110 = local_8f0;
    local_2120.m_other = 9.88131291682493e-324;
    local_2118 = (ChLoadableUV)0x36;
    local_20f8 = 0.0;
    local_20f0 = 2.47032822920623e-323;
    local_20e8 = 2.66795448754273e-322;
    *local_1d10 = 0.0;
    pdVar3[1] = 0.0;
    local_20a8 = 2.66795448754273e-322;
    local_2030 = local_a10;
    local_2088 = 8.89318162514244e-323;
    local_2080 = 1.48219693752374e-323;
    local_2078 = 2.66795448754273e-322;
    local_2048 = 0.0;
    local_2040 = 4.94065645841247e-324;
    local_2038 = 2.66795448754273e-322;
    local_2018 = 8.89318162514244e-323;
    local_2010 = 1.97626258336499e-323;
    local_2008 = 2.66795448754273e-322;
    local_1fd8 = 0.0;
    local_1fc0 = local_860;
    local_1fd0 = 9.88131291682493e-324;
    local_1fc8 = 2.66795448754273e-322;
    local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1840;
    local_1fa8 = 8.89318162514244e-323;
    local_1fa0 = 2.47032822920623e-323;
    local_1f98 = 2.66795448754273e-322;
    pMStack_2218 = pMVar1;
    local_2208.m_other = (double)local_1160;
    local_21d8 = (ChLoadableUV)local_1160;
    local_21b0.m_other = (double)local_f20;
    local_21a0 = (ChLoadableUV)local_1160;
    local_2170 = (ChLoadableUV)local_1160;
    local_2140 = local_d70;
    local_2130 = (ChLoadableUV)local_1160;
    local_2100 = (ChLoadableUV)local_1160;
    local_20d0 = (ChLoadableUV)local_1160;
    local_20c0 = (ChLoadableUV)local_1160;
    local_20a0 = &local_bc0;
    local_2090 = (ChLoadableUV)local_1160;
    local_2060 = (Layer *)local_fb0;
    local_2050 = (ChLoadableUV)local_1160;
    local_2020 = (ChLoadableUV)local_1160;
    local_1ff0 = local_e00;
    local_1fe0 = (ChLoadableUV)local_1160;
    local_1fb0 = (ChLoadableUV)local_1160;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)&local_1ba0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)0x0;
    pMStack_2210 = (MatrixNx6 *)0x0;
    local_2208.m_other = 2.66795448754273e-322;
    local_21e8 = (Matrix<double,_18,_1,_0,_18,_1> *)0x12;
    sStack_21e0.m_other = 0.0;
    local_21d8 = (ChLoadableUV)0x36;
    local_21b0.m_other = 0.0;
    local_21a8 = (RhsNested)0x1;
    local_21a0 = (ChLoadableUV)0x36;
    local_2180.m_other = 8.89318162514244e-323;
    local_2178 = (RhsNested)0x1;
    local_2170 = (ChLoadableUV)0x36;
    local_2140 = (double *)0x0;
    local_2138 = 9.88131291682493e-324;
    local_2130 = (ChLoadableUV)0x36;
    local_2110 = (undefined1 *)0x12;
    local_2108 = 9.88131291682493e-324;
    local_2100 = (ChLoadableUV)0x36;
    sStack_2230.m_other = (double)local_1160;
    CStack_2220 = (ChLoadableUV)local_1160;
    local_2200 = (PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)pMVar1;
    local_21f0 = (ChLoadableUV)local_1160;
    local_21c8 = (Layer *)local_fb0;
    local_21b8 = (ChLoadableUV)local_1160;
    local_2198 = local_f20;
    local_2188 = (ChLoadableUV)local_1160;
    local_2158 = local_e00;
    local_2148 = (ChLoadableUV)local_1160;
    local_2128 = local_d70;
    local_2118 = (ChLoadableUV)local_1160;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              (local_15f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_2240,scalar,(StorageBaseType *)local_1840);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_15f0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2240);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)&local_1ba0,xpr,
               local_23b8,0);
    CStack_2220 = (ChLoadableUV)
                  local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                  m_data.array[4];
    pMStack_2218 = (Matrix<double,_18,_1,_0,_18,_1> *)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[5];
    local_2240._0_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[0];
    local_2240._8_8_ =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    sStack_2230.m_other =
         local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    pMStack_2228 = (RhsNested)
                   local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[3];
    local_2360._0_8_ = local_15f0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_2360,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_2240);
    pCVar4 = local_1d00;
    lVar2 = local_1d18;
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               local_2240,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((local_1d00->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_material).
                       super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_1d18));
    memcpy(&local_1ba0,
           (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)(local_2240._0_8_ + 0x20),0x120);
    this_00 = (ChElementShellANCF_3833 *)(local_2240 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    RotateReorderStiffnessMatrix
              (this_00,&local_1ba0,
               *(double *)
                ((long)&((pCVar4->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_theta + lVar2));
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_17b0,(double *)&local_1ba0,(StorageBaseType *)local_1320);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_18d0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)local_13b0);
    local_1720.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = local_17b0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_1720.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = local_17b0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    local_1720.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_1720.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_1960,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_1440);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+(&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1720,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1960);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_19f0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_14d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_19f0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_1a50,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)local_1560);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1a50);
    Eigen::operator*(&local_1bc8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_15f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2240,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1bc8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_1290,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_18d0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)local_1320);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_1960,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)local_13b0);
    local_17b0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_17b0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    local_17b0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_17b0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_19f0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_1440);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+(&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_17b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_19f0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_1a50,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_14d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1a50);
    Eigen::operator*(&local_1bc8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)local_1560);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1bc8);
    Eigen::operator*(&local_1a78,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_15f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2240,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1a78);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_1720,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_1960,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)local_1320);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_19f0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)local_13b0);
    local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_18d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_1a50,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_1440);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+(&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_18d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1a50);
    Eigen::operator*(&local_1bc8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_14d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1bc8);
    Eigen::operator*(&local_1a78,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)local_1560);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1a78);
    Eigen::operator*(&local_1188,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_15f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2240,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1188);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_17b0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_19f0,local_1c00,(StorageBaseType *)local_1320);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_1a50,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)local_13b0);
    local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = (double)local_1a50._16_8_;
    local_1960.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = (double)local_1a50._24_8_;
    Eigen::operator*(&local_1bc8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x14,(StorageBaseType *)local_1440);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+(&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1960,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1bc8);
    Eigen::operator*(&local_1a78,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_14d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1a78);
    Eigen::operator*(&local_1188,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)local_1560);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1188);
    Eigen::operator*(&local_11b0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_15f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2240,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_11b0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_18d0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_2240);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_1a50,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)local_1320);
    Eigen::operator*(&local_1bc8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)local_13b0);
    local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)local_1a50._16_8_;
    local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)local_1a50._24_8_;
    local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = local_1bc8.m_lhs.m_functor.m_other;
    local_19f0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = (double)local_1bc8.m_rhs;
    Eigen::operator*(&local_1a78,local_1be8,(StorageBaseType *)local_1440);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+(&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_19f0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1a78);
    Eigen::operator*(&local_1188,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_14d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1188);
    Eigen::operator*(&local_11b0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)local_1560);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_11b0);
    Eigen::operator*(&local_11d8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_15f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2240,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_11d8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_1960,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_2240);
    Eigen::operator*(&local_1bc8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)local_1320);
    Eigen::operator*(&local_1a78,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)local_13b0);
    local_1a50._24_8_ = local_1bc8.m_lhs.m_functor.m_other;
    local_1a50._32_8_ = local_1bc8.m_rhs;
    local_1a10 = local_1a78.m_lhs.m_functor.m_other;
    local_1a08 = local_1a78.m_rhs;
    Eigen::operator*(&local_1188,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x20,(StorageBaseType *)local_1440);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+(&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1a50,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1188);
    Eigen::operator*(&local_11b0,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_14d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_1688,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_11b0);
    Eigen::operator*(&local_11d8,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)local_1560);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_1cf8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_11d8);
    Eigen::operator*(&local_1200,
                     local_1ba0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_15f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_2240,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_2360,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1200);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_19f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_2240);
    vStack_2338.m_value = 0;
    sStack_2330.m_other = 0.0;
    local_2320 = &local_1290;
    local_2328 = (RhsNested)0x36;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 0;
    local_22e8 = 0x36;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 0.0;
    local_1cf8._0_8_ = local_2240;
    local_22a0 = (RhsNested)0x36;
    vStack_1ce0.m_value = 0;
    vStack_1cd8.m_value = 0;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = (XprTypeNested)local_1160;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2310 = (Layer *)pMVar1;
    local_2300 = (XprTypeNested)local_1160;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_19f0;
    local_22c8 = (Layer *)&local_1040;
    local_22b8 = (XprTypeNested)local_1160;
    local_2298 = &local_1960;
    pMStack_1ce8 = (XprTypeNested)local_1cf8._0_8_;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    local_2320 = &local_1290;
    sStack_2330.m_other = 4.94065645841247e-324;
    local_2328 = (RhsNested)0x36;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_19f0;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 1;
    local_22e8 = 0x36;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 4.94065645841247e-324;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1bd8;
    vStack_1ce0.m_value = 0;
    vStack_1cd8.m_value = 1;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = local_fb0;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2310 = local_f20;
    local_2300 = (XprTypeNested)local_1160;
    local_22c8 = local_e90;
    local_22b8 = (XprTypeNested)local_1160;
    local_2298 = &local_1960;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    local_2320 = &local_1290;
    sStack_2330.m_other = 9.88131291682493e-324;
    local_2328 = (RhsNested)0x36;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 2;
    local_22e8 = 0x36;
    local_2298 = &local_1960;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 9.88131291682493e-324;
    local_22a0 = (RhsNested)0x36;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    local_1cf8._0_8_ = local_1be0;
    vStack_1ce0.m_value = 0;
    vStack_1cd8.m_value = 2;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = local_e00;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2310 = (Layer *)local_d70;
    local_2300 = (XprTypeNested)local_1160;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_19f0;
    local_22c8 = (Layer *)local_ce0;
    local_22b8 = (XprTypeNested)local_1160;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    sStack_2330.m_other = 0.0;
    local_2328 = (RhsNested)0x36;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 0;
    local_22e8 = 0x36;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 0.0;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1bf0;
    vStack_1ce0.m_value = 0x12;
    vStack_1cd8.m_value = 0;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = (XprTypeNested)local_1160;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2320 = &local_19f0;
    local_2310 = (Layer *)pMVar1;
    local_2300 = (XprTypeNested)local_1160;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_1720;
    local_22c8 = (Layer *)&local_1040;
    local_22b8 = (XprTypeNested)local_1160;
    local_2298 = &local_18d0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    local_2320 = &local_19f0;
    sStack_2330.m_other = 4.94065645841247e-324;
    local_2328 = (RhsNested)0x36;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 1;
    local_22e8 = 0x36;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 4.94065645841247e-324;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1bf8;
    vStack_1ce0.m_value = 0x12;
    vStack_1cd8.m_value = 1;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = local_fb0;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2310 = local_f20;
    local_2300 = (XprTypeNested)local_1160;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_1720;
    local_22c8 = local_e90;
    local_22b8 = (XprTypeNested)local_1160;
    local_2298 = &local_18d0;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    local_2320 = &local_19f0;
    sStack_2330.m_other = 9.88131291682493e-324;
    local_2328 = (RhsNested)0x36;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_1720;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 2;
    local_22e8 = 0x36;
    local_2298 = &local_18d0;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 9.88131291682493e-324;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1c08;
    vStack_1ce0.m_value = 0x12;
    vStack_1cd8.m_value = 2;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = local_e00;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2310 = (Layer *)local_d70;
    local_2300 = (XprTypeNested)local_1160;
    local_22c8 = (Layer *)local_ce0;
    local_22b8 = (XprTypeNested)local_1160;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_18d0;
    vStack_2338.m_value = 0;
    sStack_2330.m_other = 0.0;
    local_2328 = (RhsNested)0x36;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 0;
    local_22e8 = 0x36;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 0.0;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1c10;
    vStack_1ce0.m_value = 0x24;
    vStack_1cd8.m_value = 0;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = (XprTypeNested)local_1160;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2320 = &local_1960;
    local_2310 = (Layer *)pMVar1;
    local_2300 = (XprTypeNested)local_1160;
    local_22c8 = (Layer *)&local_1040;
    local_22b8 = (XprTypeNested)local_1160;
    local_2298 = &local_17b0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    sStack_2330.m_other = 4.94065645841247e-324;
    local_2328 = (RhsNested)0x36;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_18d0;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 1;
    local_22e8 = 0x36;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 4.94065645841247e-324;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1c18;
    vStack_1ce0.m_value = 0x24;
    vStack_1cd8.m_value = 1;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = local_fb0;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2320 = &local_1960;
    local_2310 = local_f20;
    local_2300 = (XprTypeNested)local_1160;
    local_22c8 = local_e90;
    local_22b8 = (XprTypeNested)local_1160;
    local_2298 = &local_17b0;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    vStack_2338.m_value = 0;
    local_2320 = &local_1960;
    sStack_2330.m_other = 9.88131291682493e-324;
    local_2328 = (RhsNested)0x36;
    local_22e0 = (PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_18d0;
    local_22f8.m_value = 0x12;
    local_22f0.m_value = 2;
    local_22e8 = 0x36;
    local_2298 = &local_17b0;
    local_22b0.m_value = 0x24;
    local_22a8.m_other = 9.88131291682493e-324;
    local_22a0 = (RhsNested)0x36;
    local_1cf8._0_8_ = local_1c20;
    vStack_1ce0.m_value = 0x24;
    vStack_1cd8.m_value = 2;
    sStack_1cd0.m_other = 2.66795448754273e-322;
    local_2360._16_8_ = local_e00;
    pMStack_2340 = (XprTypeNested)local_1160;
    local_2310 = (Layer *)local_d70;
    local_2300 = (XprTypeNested)local_1160;
    local_22c8 = (Layer *)local_ce0;
    local_22b8 = (XprTypeNested)local_1160;
    pMStack_1ce8 = (XprTypeNested)local_2240;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)local_1cf8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_2360);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_24,_54,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false> *)local_1cf8,
               local_1d08,0,local_2248);
    local_1688._0_8_ = local_740;
    pMStack_2340 = (XprTypeNested)vStack_1cd8.m_value;
    vStack_2338.m_value = (long)sStack_1cd0.m_other;
    local_2360._0_8_ = local_1cf8._0_8_;
    local_2360._8_8_ = local_1cf8._8_8_;
    local_2360._16_8_ = pMStack_1ce8;
    lStack_2348 = vStack_1ce0.m_value;
    sStack_2330.m_other = (double)local_2240;
    Eigen::NoAlias<Eigen::Matrix<double,24,3,1,24,3>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,24,3,1,24,3>,Eigen::MatrixBase> *)&local_1688,
               (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>,_Eigen::Matrix<double,_54,_3,_0,_54,_3>,_0>_>
                *)local_2360);
    local_1d18 = local_1d18 + 0x20;
    local_23b8 = local_23b8 + 0x12;
    startCol = local_2248 + 0x36;
    uVar5 = local_1bd0 + 1;
  }
  local_1160._0_8_ = local_740;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,72,1,0,72,1>,0,Eigen::Stride<0,0>>>
            (local_1c28,
             (Map<Eigen::Matrix<double,_72,_1,_0,_72,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1160);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.  Note that the integrand for the generalize internal force vector for a straight and normalized element
    // is of order : 8 in xi, 8 in eta, and 8 in zeta. This requires GQ 5 points along the xi and eta directions and 5
    // points along zeta direction for "Full Integration". However, very similar results can be obtained with fewer GQ
    // point in each direction, resulting in significantly fewer calculations.  Based on testing, this could be as low
    // as 3x3x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    MatrixNx3 QiCompact;
    QiCompact.setZero();

    // Loop over all of the layers summing the contribution to the generalized internal force vector from each layer
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
        // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
        // The entries are grouped by component in block matrices (column vectors)
        // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
        //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
        //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
        //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> P_Block;

        P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

        P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

        P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

        // =============================================================================
        // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix for the current
        // layer to get the generalized force vector in matrix form (in the correct order if its calculated in row-major
        // memory layout)
        // =============================================================================

        QiCompact.noalias() += m_SD.block<NSF, 3 * NIP>(0, 3 * kl * NIP) * P_Block;
    }

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}